

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cpp
# Opt level: O3

bool miniros::service::waitForService(string *service_name,Duration *timeout)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint __seconds;
  DurationBase<miniros::WallDuration> *pDVar4;
  WallTime current_time;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  WallTime start_time;
  WallDuration wall_timeout;
  string mapped_name;
  TimeBase<miniros::WallTime,_miniros::WallDuration> local_38;
  
  names::resolve(&mapped_name,service_name,true);
  start_time = WallTime::now();
  wall_timeout.super_DurationBase<miniros::WallDuration>.sec = 0;
  wall_timeout.super_DurationBase<miniros::WallDuration>.nsec = 0;
  DurationBase<miniros::WallDuration>::fromSec
            (&wall_timeout.super_DurationBase<miniros::WallDuration>,
             (double)(timeout->super_DurationBase<miniros::Duration>).nsec * 1e-09 +
             (double)(timeout->super_DurationBase<miniros::Duration>).sec);
  bVar3 = false;
  while( true ) {
    bVar1 = ok();
    if (!bVar1) break;
    bVar2 = exists(service_name,(bool)~bVar3);
    if (bVar2) break;
    current_time.super_TimeBase<miniros::WallTime,_miniros::WallDuration>.sec = 0;
    current_time.super_TimeBase<miniros::WallTime,_miniros::WallDuration>.nsec = 0;
    DurationBase<miniros::WallDuration>::fromSec
              ((DurationBase<miniros::WallDuration> *)&current_time,0.0);
    __seconds = (uint)&current_time;
    bVar3 = DurationBase<miniros::WallDuration>::operator>=
                      (&wall_timeout.super_DurationBase<miniros::WallDuration>,
                       (WallDuration *)&current_time);
    if (bVar3) {
      current_time = WallTime::now();
      TimeBase<miniros::WallTime,_miniros::WallDuration>::operator-(&local_38,&current_time);
      pDVar4 = &wall_timeout.super_DurationBase<miniros::WallDuration>;
      bVar3 = DurationBase<miniros::WallDuration>::operator>=
                        ((DurationBase<miniros::WallDuration> *)&local_38,
                         (WallDuration *)&wall_timeout.super_DurationBase<miniros::WallDuration>);
      __seconds = (uint)pDVar4;
      if (bVar3) {
        bVar1 = false;
        goto LAB_001fa77e;
      }
    }
    current_time.super_TimeBase<miniros::WallTime,_miniros::WallDuration>.sec = 0;
    current_time.super_TimeBase<miniros::WallTime,_miniros::WallDuration>.nsec = 0;
    DurationBase<miniros::WallDuration>::fromSec
              ((DurationBase<miniros::WallDuration> *)&current_time,0.02);
    WallDuration::sleep((WallDuration *)&current_time,__seconds);
    bVar3 = true;
  }
  if (bVar3) {
    bVar3 = ok();
    if (bVar3) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (waitForService::loc.initialized_ == false) {
        current_time.super_TimeBase<miniros::WallTime,_miniros::WallDuration> =
             (TimeBase<miniros::WallTime,_miniros::WallDuration>)&local_78;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&current_time,"miniros.unknown_package","");
        console::initializeLogLocation(&waitForService::loc,(string *)&current_time,Info);
        if (current_time.super_TimeBase<miniros::WallTime,_miniros::WallDuration> !=
            (TimeBase<miniros::WallTime,_miniros::WallDuration>)&local_78) {
          operator_delete((void *)current_time.
                                  super_TimeBase<miniros::WallTime,_miniros::WallDuration>,
                          local_78._M_allocated_capacity + 1);
        }
      }
      if (waitForService::loc.level_ != Info) {
        console::setLogLocationLevel(&waitForService::loc,Info);
        console::checkLogLocationEnabled(&waitForService::loc);
      }
      if (waitForService::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,waitForService::loc.logger_,waitForService::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service.cpp"
                       ,0x7b,
                       "bool miniros::service::waitForService(const std::string &, miniros::Duration)"
                       ,"waitForService: Service [%s] is now available.",
                       mapped_name._M_dataplus._M_p);
      }
    }
  }
LAB_001fa77e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mapped_name._M_dataplus._M_p != &mapped_name.field_2) {
    operator_delete(mapped_name._M_dataplus._M_p,mapped_name.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool service::waitForService(const std::string& service_name, miniros::Duration timeout)
{
  std::string mapped_name = names::resolve(service_name);

  const WallTime start_time = WallTime::now();
  const WallDuration wall_timeout{timeout.toSec()};

  bool printed = false;
  bool result = false;
  while (miniros::ok())
  {
    if (exists(service_name, !printed))
    {
      result = true;
      break;
    }
    else
    {
      printed = true;

      if (wall_timeout >= WallDuration(0))
      {
        const WallTime current_time = WallTime::now();

        if ((current_time - start_time) >= wall_timeout)
        {
          return false;
        }
      }

      WallDuration(0.02).sleep();
    }
  }

  if (printed && miniros::ok())
  {
    MINIROS_INFO("waitForService: Service [%s] is now available.", mapped_name.c_str());
  }

  return result;
}